

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

void HTS_ModelSet_get_duration(HTS_ModelSet *ms,char *string,double *iw,double *mean,double *vari)

{
  double dVar1;
  double in_RCX;
  double *in_RDX;
  double *in_RSI;
  double *in_RDI;
  long in_R8;
  size_t len;
  size_t i;
  double local_30;
  
  dVar1 = in_RDI[4];
  for (local_30 = 0.0; (ulong)local_30 < (ulong)dVar1; local_30 = (double)((long)local_30 + 1)) {
    *(undefined8 *)((long)in_RCX + (long)local_30 * 8) = 0;
    *(undefined8 *)(in_R8 + (long)local_30 * 8) = 0;
  }
  for (local_30 = 0.0; (ulong)local_30 < (ulong)in_RDI[3]; local_30 = (double)((long)local_30 + 1))
  {
    if ((in_RDX[(long)local_30] != 0.0) || (NAN(in_RDX[(long)local_30]))) {
      HTS_Model_add_parameter((HTS_Model *)vari,i,(char *)len,in_RDI,in_RSI,in_RDX,in_RCX);
    }
  }
  return;
}

Assistant:

void HTS_ModelSet_get_duration(HTS_ModelSet * ms, const char *string, const double *iw, double *mean, double *vari)
{
   size_t i;
   size_t len = ms->num_states;

   for (i = 0; i < len; i++) {
      mean[i] = 0.0;
      vari[i] = 0.0;
   }
   for (i = 0; i < ms->num_voices; i++)
      if (iw[i] != 0.0)
         HTS_Model_add_parameter(&ms->duration[i], 2, string, mean, vari, NULL, iw[i]);
}